

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O1

ggml_backend_dev_t ggml_backend_cpu_reg_get_device(ggml_backend_reg_t reg,size_t index)

{
  int iVar1;
  
  if (index == 0) {
    if (ggml_backend_cpu_reg_get_device(ggml_backend_reg*,unsigned_long)::ctx == '\0') {
      iVar1 = __cxa_guard_acquire(&ggml_backend_cpu_reg_get_device(ggml_backend_reg*,unsigned_long)
                                   ::ctx);
      if (iVar1 != 0) {
        ggml_backend_cpu_device_context::ggml_backend_cpu_device_context
                  (&ggml_backend_cpu_reg_get_device::ctx);
        __cxa_atexit(ggml_backend_cpu_device_context::~ggml_backend_cpu_device_context,
                     &ggml_backend_cpu_reg_get_device::ctx,&__dso_handle);
        __cxa_guard_release(&ggml_backend_cpu_reg_get_device(ggml_backend_reg*,unsigned_long)::ctx);
      }
    }
    if (ggml_backend_cpu_reg_get_device(ggml_backend_reg*,unsigned_long)::ggml_backend_cpu_device ==
        '\0') {
      ggml_backend_cpu_reg_get_device();
    }
    return &ggml_backend_cpu_reg_get_device::ggml_backend_cpu_device;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.cpp"
             ,0x1dc,"GGML_ASSERT(%s) failed","index == 0");
}

Assistant:

static ggml_backend_dev_t ggml_backend_cpu_reg_get_device(ggml_backend_reg_t reg, size_t index) {
    GGML_ASSERT(index == 0);

    static ggml_backend_cpu_device_context ctx;
    static ggml_backend_device ggml_backend_cpu_device = {
        /* .iface   = */ ggml_backend_cpu_device_i,
        /* .reg     = */ reg,
        /* .context = */ &ctx,
    };

    return &ggml_backend_cpu_device;
}